

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O0

ktx_error_code_e
ktxTexture2_transcodeUastc
          (ktxTexture2 *This,alpha_content_e alphaContent,ktxTexture2 *prototype,
          ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ktx_size_t kVar4;
  ktx_size_t kVar5;
  size_type sVar6;
  uint8_t *pCompressed_data;
  byte bVar7;
  long in_RDX;
  undefined8 unaff_RBX;
  basisu_transcoder_state *unaff_RBP;
  ktxTexture2 *in_RDI;
  uint32_t in_R8D;
  undefined8 unaff_R12;
  undefined8 unaff_R15;
  float fVar8;
  uint32_t unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  basisu_transcoder_state *xcoderState;
  uint32_t image;
  bool status;
  uint32_t stateIndex;
  uint32_t levelBlocksY;
  uint32_t levelBlocksX;
  uint32_t bh;
  uint32_t bw;
  uint32_t levelHeight;
  uint32_t levelWidth;
  ktx_uint32_t levelImageCount;
  ktx_size_t levelSizeOut;
  ktx_size_t levelImageSizeOut;
  ktx_size_t levelImageOffsetIn;
  ktx_size_t levelImageSizeIn;
  uint64_t writeOffsetBlocks;
  uint64_t writeOffset;
  ktx_uint32_t depth;
  ktx_int32_t level;
  vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  xcoderStates;
  basisu_lowlevel_uastc_transcoder uit;
  ktx_size_t levelOffsetWrite;
  ktxLevelIndexEntry *protoLevelIndex;
  ktxTexture2_private *protoPriv;
  ktx_size_t xcodedDataLength;
  ktx_uint32_t outputBlockByteLength;
  ktx_uint8_t *pXcodedData;
  uint in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  ktxFormatVersionEnum in_stack_fffffffffffffe30;
  ktx_uint32_t in_stack_fffffffffffffe34;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  float local_174;
  uint local_134;
  uint local_130;
  uint local_118;
  uint local_110;
  long local_f0;
  ktx_uint64_t local_e0;
  undefined4 local_d8;
  ktx_uint32_t level_00;
  undefined4 in_stack_ffffffffffffff4c;
  transcoder_texture_format in_stack_ffffffffffffff54;
  pointer in_stack_ffffffffffffff58;
  basisu_lowlevel_uastc_transcoder local_89;
  uint8_t *local_88;
  long local_80;
  long local_78;
  ulong local_70;
  uint local_64;
  undefined8 uVar9;
  uint32_t in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffc8;
  ktx_error_code_e local_34;
  
  if (in_RDI->supercompressionScheme == KTX_SS_BASIS_LZ) {
    __assert_fail("This->supercompressionScheme != KTX_SS_BASIS_LZ",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x28f,
                  "ktx_error_code_e ktxTexture2_transcodeUastc(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  uVar9 = *(undefined8 *)(in_RDX + 0x70);
  local_64 = *(uint *)(*(long *)(in_RDX + 0x18) + 0x20) >> 3;
  local_70 = *(ulong *)(in_RDX + 0x68) / (ulong)local_64;
  local_78 = *(long *)(in_RDX + 0xa0);
  local_80 = local_78 + 0x20;
  local_88 = (uint8_t *)0x0;
  basist::basisu_lowlevel_uastc_transcoder::basisu_lowlevel_uastc_transcoder(&local_89);
  std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>::
  vector((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
          *)0x11f8a7);
  std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>::
  resize((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
          *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
         CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  level_00 = in_RDI->numLevels;
  local_d8 = in_stack_fffffffffffffe38;
  do {
    level_00 = level_00 - 1;
    if ((int)level_00 < 0) {
      uVar2 = *(uint *)(local_78 + 8);
      local_174 = (float)local_88;
      fVar8 = ceilf(local_174 / (float)uVar2);
      local_88 = (uint8_t *)((long)((float)uVar2 * fVar8) & 0xffffffff);
      local_34 = KTX_SUCCESS;
LAB_0011fee8:
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::~vector((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                 *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20));
      return local_34;
    }
    uVar3 = (ulong)local_88 / (ulong)local_64;
    bVar7 = (byte)level_00;
    if (in_RDI->baseHeight >> (bVar7 & 0x1f) == 0) {
      local_130 = 1;
    }
    else {
      local_130 = in_RDI->baseHeight >> (bVar7 & 0x1f);
    }
    local_110 = 0;
    if (in_RDI->baseDepth >> (bVar7 & 0x1f) == 0) {
      local_134 = 1;
    }
    else {
      local_134 = in_RDI->baseDepth >> (bVar7 & 0x1f);
    }
    uVar2 = in_RDI->numLayers * in_RDI->numFaces * local_134;
    pCompressed_data = local_88;
    kVar4 = ktxTexture_calcImageSize
                      ((ktxTexture *)CONCAT44(in_stack_fffffffffffffe3c,local_d8),
                       in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    kVar5 = ktxTexture_calcImageSize
                      ((ktxTexture *)CONCAT44(in_stack_fffffffffffffe3c,local_d8),
                       in_stack_fffffffffffffe34,in_stack_fffffffffffffe30);
    local_e0 = ktxTexture2_levelDataOffset(in_RDI,level_00);
    local_f0 = 0;
    for (local_118 = 0; local_118 < uVar2; local_118 = local_118 + 1) {
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::operator[]((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                    *)&stack0xffffffffffffff58,(ulong)local_110);
      local_110 = local_110 + 1;
      sVar6 = std::
              vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
              ::size((vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                      *)&stack0xffffffffffffff58);
      if (local_110 == sVar6) {
        local_110 = 0;
      }
      local_d8 = (undefined4)kVar4;
      in_stack_fffffffffffffe20 = local_130;
      in_stack_fffffffffffffe30 = (ktxFormatVersionEnum)local_e0;
      bVar1 = basist::basisu_lowlevel_uastc_transcoder::transcode_image
                        ((basisu_lowlevel_uastc_transcoder *)in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff54,
                         (void *)CONCAT44(in_stack_ffffffffffffff4c,level_00),local_134,
                         pCompressed_data,(uint32_t)(uVar3 >> 0x20),(uint32_t)uVar9,in_R8D,
                         (uint32_t)in_RDX,in_stack_ffffffffffffffb8,(uint32_t)in_RDI,
                         in_stack_ffffffffffffffc8,(uint32_t)unaff_RBX,(uint32_t)unaff_R12,
                         SUB81(uVar3 >> 0x18,0),SUB81(uVar3 >> 0x10,0),(uint32_t)unaff_R15,unaff_RBP
                         ,unaff_retaddr,in_stack_00000008,in_stack_00000010);
      if (!bVar1) {
        local_34 = KTX_TRANSCODE_FAILED;
        goto LAB_0011fee8;
      }
      pCompressed_data = pCompressed_data + kVar5;
      local_f0 = kVar5 + local_f0;
      local_e0 = kVar4 + local_e0;
    }
    *(uint8_t **)(local_80 + (long)(int)level_00 * 0x18) = local_88;
    *(long *)(local_80 + (long)(int)level_00 * 0x18 + 8) = local_f0;
    *(long *)(local_80 + (long)(int)level_00 * 0x18 + 0x10) = local_f0;
    local_88 = local_88 + local_f0;
  } while( true );
}

Assistant:

KTX_error_code
ktxTexture2_transcodeUastc(ktxTexture2* This,
                           alpha_content_e alphaContent,
                           ktxTexture2* prototype,
                           ktx_transcode_fmt_e outputFormat,
                           ktx_transcode_flags transcodeFlags)
{
    assert(This->supercompressionScheme != KTX_SS_BASIS_LZ);

    ktx_uint8_t* pXcodedData = prototype->pData;
    ktx_uint32_t outputBlockByteLength
                      = prototype->_protected->_formatSize.blockSizeInBits / 8;
    ktx_size_t xcodedDataLength
                      = prototype->dataSize / outputBlockByteLength;
    DECLARE_PRIVATE(protoPriv, prototype);
    ktxLevelIndexEntry* protoLevelIndex = protoPriv._levelIndex;
    ktx_size_t levelOffsetWrite = 0;

    basisu_lowlevel_uastc_transcoder uit;
    // See comment on same declaration in transcodeEtc1s.
    std::vector<basisu_transcoder_state> xcoderStates;
    xcoderStates.resize(This->isVideo ? This->numFaces : 1);

    for (ktx_int32_t level = This->numLevels - 1; level >= 0; level--)
    {
        ktx_uint32_t depth;
        uint64_t writeOffset = levelOffsetWrite;
        uint64_t writeOffsetBlocks = levelOffsetWrite / outputBlockByteLength;
        ktx_size_t levelImageSizeIn, levelImageOffsetIn;
        ktx_size_t levelImageSizeOut, levelSizeOut;
        ktx_uint32_t levelImageCount;
        uint32_t levelWidth = MAX(1, This->baseWidth >> level);
        uint32_t levelHeight = MAX(1, This->baseHeight >> level);
        // UASTC texel block dimensions
        const uint32_t bw = 4, bh = 4;
        uint32_t levelBlocksX = (levelWidth + (bw - 1)) / bw;
        uint32_t levelBlocksY = (levelHeight + (bh - 1)) / bh;
        uint32_t stateIndex = 0;

        depth = MAX(1, This->baseDepth  >> level);

        levelImageCount = This->numLayers * This->numFaces * depth;
        levelImageSizeIn = ktxTexture_calcImageSize(ktxTexture(This), level,
                                                    KTX_FORMAT_VERSION_TWO);
        levelImageSizeOut = ktxTexture_calcImageSize(ktxTexture(prototype),
                                                     level,
                                                     KTX_FORMAT_VERSION_TWO);

        levelImageOffsetIn = ktxTexture2_levelDataOffset(This, level);
        levelSizeOut = 0;
        bool status;
        for (uint32_t image = 0; image < levelImageCount; image++) {
            basisu_transcoder_state& xcoderState = xcoderStates[stateIndex];
            // See comment before same lines in transcodeEtc1s.
            if (++stateIndex == xcoderStates.size())
                stateIndex = 0;

            status = uit.transcode_image(
                          (transcoder_texture_format)outputFormat,
                          pXcodedData + writeOffset,
                          (uint32_t)(xcodedDataLength - writeOffsetBlocks),
                          This->pData,
                          (uint32_t)This->dataSize,
                          levelBlocksX,
                          levelBlocksY,
                          levelWidth,
                          levelHeight,
                          level,
                          (uint32_t)levelImageOffsetIn,
                          (uint32_t)levelImageSizeIn,
                          transcodeFlags,
                          alphaContent != eNone,
                          This->isVideo, // is_video
                          //imageDesc.imageFlags ^ cSliceDescFlagsFrameIsIFrame,
                          0, // output_row_pitch_in_blocks_or_pixels
                          &xcoderState, // pState
                          0, // output_rows_in_pixels,
                          -1, // channel0
                          -1  // channel1
                          );
            if (!status)
                return KTX_TRANSCODE_FAILED;
            writeOffset += levelImageSizeOut;
            levelSizeOut += levelImageSizeOut;
            levelImageOffsetIn += levelImageSizeIn;
        }
        protoLevelIndex[level].byteOffset = levelOffsetWrite;
        // writeOffset will be equal to total size of the images in the level.
        protoLevelIndex[level].byteLength = levelSizeOut;
        protoLevelIndex[level].uncompressedByteLength = levelSizeOut;
        levelOffsetWrite += levelSizeOut;
    }
    // In case of transcoding to uncompressed.
    levelOffsetWrite = _KTX_PADN(protoPriv._requiredLevelAlignment,
                                 levelOffsetWrite);
    return KTX_SUCCESS;
}